

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t flush(ion_bpp_handle_t handle,ion_bpp_buffer_t *buf)

{
  ion_err_t iVar1;
  ion_bpp_err_t iVar2;
  uint num_bytes;
  
  num_bytes = *(uint *)((long)handle + 0x10) * 3;
  if (buf->adr != 0) {
    num_bytes = *(uint *)((long)handle + 0x10);
  }
  iVar1 = ion_fwrite_at(*handle,buf->adr,num_bytes,(ion_byte_t *)buf->p);
  if (iVar1 == '\0') {
    buf->modified = boolean_false;
    nDiskWrites = nDiskWrites + 1;
    iVar2 = bErrOk;
  }
  else {
    iVar2 = bErrIO;
    if (bErrLineNo == 0) {
      bErrLineNo = 0xc6;
    }
  }
  return iVar2;
}

Assistant:

static ion_bpp_err_t
flush(
	ion_bpp_handle_t	handle,
	ion_bpp_buffer_t	*buf
) {
	ion_bpp_h_node_t	*h = handle;
	int					len;/* number of bytes to write */
	ion_err_t			err;

	/* flush buffer to disk */
	len = h->sectorSize;

	if (buf->adr == 0) {
		len *= 3;	/* root */
	}

	err = ion_fwrite_at(h->fp, buf->adr, len, (ion_byte_t *) buf->p);

	if (err_ok != err) {
		return error(bErrIO);
	}

#if 0
	/* flush buffer to disk */
	len = 1;

	if (buf->adr == 0) {
		len = 3;/* root */
	}

	if (0 != fseek(h->fp, buf->adr, SEEK_SET)) {
		return error(bErrIO);
	}

	for (i = 0; i < len; i++) {
		if (1 != fwrite(&buf[i].p->leaf, sizeof(buf->p->leaf), 1, h->fp)) {
			return error(bErrIO);
		}

		if (1 != fwrite(&buf[i].p->ct, sizeof(buf->p->ct), 1, h->fp)) {
			return error(bErrIO);
		}

		if (1 != fwrite(&buf[i].p->prev, sizeof(buf->p->prev), 1, h->fp)) {
			return error(bErrIO);
		}

		if (1 != fwrite(&buf[i].p->next, sizeof(buf->p->next), 1, h->fp)) {
			return error(bErrIO);
		}

		if (1 != fwrite(&buf[i].p->childLT, sizeof(buf->p->childLT), 1, h->fp)) {
			return error(bErrIO);
		}

		if (1 != fwrite(&buf[i].p->fkey, sizeof(buf->p->fkey), 1, h->fp)) {
			return error(bErrIO);
		}
	}

#endif

	buf->modified = boolean_false;
	nDiskWrites++;
	return bErrOk;
}